

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

IndexPair __thiscall
slang::IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u>::
modifyRoot<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>,slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>,false>
          (IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u> *this,
          BranchNode<unsigned_long,_8U,_true> *rootNode,uint32_t position,allocator_type *alloc)

{
  unsigned_long *puVar1;
  interval<unsigned_long> *piVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long uVar6;
  BranchNode<unsigned_long,_8U,_false> *pBVar7;
  long lVar8;
  long lVar9;
  uint32_t uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  bool bVar15;
  uint32_t sizes [2];
  NodeRef nodes [2];
  uint32_t local_58 [2];
  IndexPair local_50;
  ulong local_48 [3];
  
  local_50 = IntervalMapDetails::distribute(2,*(uint32_t *)(this + 0xc4),8,local_58,position);
  local_48[0] = 0;
  local_48[1] = 0;
  uVar14 = 0;
  lVar8 = 0;
  do {
    pBVar7 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)alloc);
    uVar3 = local_58[lVar8];
    if (uVar3 != 0) {
      lVar9 = 0x20;
      uVar10 = uVar3;
      uVar12 = uVar14;
      do {
        *(uintptr_t *)
         ((long)((pBVar7->
                 super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                 ).first + -4) + lVar9) =
             (rootNode->
             super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
             ).first[uVar12].pip.value;
        piVar2 = (rootNode->
                 super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                 ).second + uVar12;
        uVar6 = piVar2->right;
        puVar1 = (unsigned_long *)
                 ((long)&(pBVar7->
                         super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                         ).first[0].pip.value + lVar9 * 2);
        *puVar1 = piVar2->left;
        puVar1[1] = uVar6;
        uVar12 = uVar12 + 1;
        lVar9 = lVar9 + 8;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    uVar14 = uVar14 + uVar3;
    local_48[lVar8] = (ulong)pBVar7 & 0xffffffffffffffc0 | (ulong)(uVar3 - 1);
    bVar15 = lVar8 == 0;
    lVar8 = lVar8 + 1;
  } while (bVar15);
  lVar8 = 0;
  do {
    uVar4 = local_48[lVar8];
    uVar11 = uVar4 & 0xffffffffffffffc0;
    uVar13 = *(ulong *)(uVar11 + 0x48);
    if (1 < (ulong)local_58[lVar8]) {
      lVar9 = 0;
      do {
        uVar5 = *(ulong *)(uVar11 + 0x58 + lVar9);
        if (uVar13 <= uVar5) {
          uVar13 = uVar5;
        }
        lVar9 = lVar9 + 0x10;
      } while ((ulong)local_58[lVar8] * 0x10 + -0x10 != lVar9);
    }
    *(undefined8 *)(this + lVar8 * 0x10 + 0x40) = *(undefined8 *)(uVar11 + 0x40);
    *(ulong *)(this + lVar8 * 0x10 + 0x48) = uVar13;
    *(ulong *)(this + lVar8 * 8) = uVar4;
    bVar15 = lVar8 == 0;
    lVar8 = lVar8 + 1;
  } while (bVar15);
  *(undefined4 *)(this + 0xc4) = 2;
  *(int *)(this + 0xc0) = *(int *)(this + 0xc0) + 1;
  return local_50;
}

Assistant:

IntervalMapDetails::IndexPair IntervalMap<TKey, TValue, N>::modifyRoot(TRootNode& rootNode,
                                                                       uint32_t position,
                                                                       allocator_type& alloc) {
    using namespace IntervalMapDetails;

    // Split the root branch node into two new nodes.
    constexpr uint32_t NumNodes = 2;
    uint32_t sizes[NumNodes];
    IndexPair newOffset = distribute(NumNodes, rootSize, Leaf::Capacity, sizes, position);

    // Construct new nodes.
    uint32_t pos = 0;
    NodeRef nodes[NumNodes];
    for (uint32_t i = 0; i < NumNodes; i++) {
        auto newNode = alloc.template emplace<TNewNode>();
        uint32_t size = sizes[i];

        newNode->copy(rootNode, pos, 0, size);
        nodes[i] = NodeRef(newNode, size);
        pos += size;
    }

    if (SwitchToBranch) {
        // Destroy the old root leaf and switch it to a branch node.
        rootLeaf.~RootLeaf();
        new (&rootBranch) RootBranch();
    }

    for (uint32_t i = 0; i < NumNodes; i++) {
        rootBranch.keyAt(i) = nodes[i].template get<TNewNode>().getBounds(sizes[i]);
        rootBranch.childAt(i) = nodes[i];
    }

    rootSize = NumNodes;
    height++;
    return newOffset;
}